

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

bam_pileup1_t * bam_plp_auto(bam_plp_t iter,int *_tid,int *_pos,int *_n_plp)

{
  int iVar1;
  bam_pileup1_t *pbVar2;
  int ret;
  bam_pileup1_t *plp;
  int *_n_plp_local;
  int *_pos_local;
  int *_tid_local;
  bam_plp_t iter_local;
  
  if ((iter->func == (bam_plp_auto_f)0x0) || (iter->error != 0)) {
    *_n_plp = -1;
    iter_local = (bam_plp_t)0x0;
  }
  else {
    iter_local = (bam_plp_t)bam_plp_next(iter,_tid,_pos,_n_plp);
    if (iter_local == (bam_plp_t)0x0) {
      *_n_plp = 0;
      if (iter->is_eof == 0) {
        do {
          iVar1 = (*iter->func)(iter->data,iter->b);
          if (iVar1 < 0) {
            if (iVar1 < -1) {
              iter->error = iVar1;
              *_n_plp = -1;
              return (bam_pileup1_t *)0x0;
            }
            bam_plp_push(iter,(bam1_t *)0x0);
            pbVar2 = bam_plp_next(iter,_tid,_pos,_n_plp);
            if (pbVar2 != (bam_pileup1_t *)0x0) {
              return pbVar2;
            }
            return (bam_pileup1_t *)0x0;
          }
          iVar1 = bam_plp_push(iter,iter->b);
          if (iVar1 < 0) {
            *_n_plp = -1;
            return (bam_pileup1_t *)0x0;
          }
          iter_local = (bam_plp_t)bam_plp_next(iter,_tid,_pos,_n_plp);
        } while (iter_local == (bam_plp_t)0x0);
      }
      else {
        iter_local = (bam_plp_t)0x0;
      }
    }
  }
  return (bam_pileup1_t *)iter_local;
}

Assistant:

const bam_pileup1_t *bam_plp_auto(bam_plp_t iter, int *_tid, int *_pos, int *_n_plp)
{
    const bam_pileup1_t *plp;
    if (iter->func == 0 || iter->error) { *_n_plp = -1; return 0; }
    if ((plp = bam_plp_next(iter, _tid, _pos, _n_plp)) != 0) return plp;
    else { // no pileup line can be obtained; read alignments
        *_n_plp = 0;
        if (iter->is_eof) return 0;
        int ret;
        while ( (ret=iter->func(iter->data, iter->b)) >= 0) {
            if (bam_plp_push(iter, iter->b) < 0) {
                *_n_plp = -1;
                return 0;
            }
            if ((plp = bam_plp_next(iter, _tid, _pos, _n_plp)) != 0) return plp;
            // otherwise no pileup line can be returned; read the next alignment.
        }
        if ( ret < -1 ) { iter->error = ret; *_n_plp = -1; return 0; }
        bam_plp_push(iter, 0);
        if ((plp = bam_plp_next(iter, _tid, _pos, _n_plp)) != 0) return plp;
        return 0;
    }
}